

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rbuVfsShmLock(sqlite3_file *pFile,int ofst,int n,int flags)

{
  sqlite3_io_methods *psVar1;
  bool bVar2;
  int local_34;
  int bCapture;
  int rc;
  sqlite3rbu *pRbu;
  rbu_file *p;
  int flags_local;
  int n_local;
  int ofst_local;
  sqlite3_file *pFile_local;
  
  psVar1 = pFile[3].pMethods;
  local_34 = 0;
  if ((psVar1 == (sqlite3_io_methods *)0x0) || ((psVar1->iVersion != 1 && (psVar1->iVersion != 2))))
  {
    bVar2 = false;
    if ((n == 1) &&
       (((((flags & 8U) != 0 && (psVar1 != (sqlite3_io_methods *)0x0)) && (psVar1->iVersion == 3))
        && (((ofst == 0 || (ofst == 1)) || (ofst == 3)))))) {
      bVar2 = true;
    }
    if (((!bVar2) || ((flags & 1U) == 0)) &&
       ((local_34 = (**(code **)(*(long *)pFile[1].pMethods + 0x70))(pFile[1].pMethods,ofst,n,flags)
        , bVar2 && (local_34 == 0)))) {
      *(uint *)((long)&psVar1[1].xFetch + 4) =
           1 << ((byte)ofst & 0x1f) | *(uint *)((long)&psVar1[1].xFetch + 4);
    }
  }
  else if ((ofst == 1) && (n == 1)) {
    local_34 = 5;
  }
  return local_34;
}

Assistant:

static int rbuVfsShmLock(sqlite3_file *pFile, int ofst, int n, int flags){
  rbu_file *p = (rbu_file*)pFile;
  sqlite3rbu *pRbu = p->pRbu;
  int rc = SQLITE_OK;

#ifdef SQLITE_AMALGAMATION
    assert( WAL_CKPT_LOCK==1 );
#endif

  assert( p->openFlags & (SQLITE_OPEN_MAIN_DB|SQLITE_OPEN_TEMP_DB) );
  if( pRbu && (pRbu->eStage==RBU_STAGE_OAL || pRbu->eStage==RBU_STAGE_MOVE) ){
    /* Magic number 1 is the WAL_CKPT_LOCK lock. Preventing SQLite from
    ** taking this lock also prevents any checkpoints from occurring. 
    ** todo: really, it's not clear why this might occur, as 
    ** wal_autocheckpoint ought to be turned off.  */
    if( ofst==WAL_LOCK_CKPT && n==1 ) rc = SQLITE_BUSY;
  }else{
    int bCapture = 0;
    if( n==1 && (flags & SQLITE_SHM_EXCLUSIVE)
     && pRbu && pRbu->eStage==RBU_STAGE_CAPTURE
     && (ofst==WAL_LOCK_WRITE || ofst==WAL_LOCK_CKPT || ofst==WAL_LOCK_READ0)
    ){
      bCapture = 1;
    }

    if( bCapture==0 || 0==(flags & SQLITE_SHM_UNLOCK) ){
      rc = p->pReal->pMethods->xShmLock(p->pReal, ofst, n, flags);
      if( bCapture && rc==SQLITE_OK ){
        pRbu->mLock |= (1 << ofst);
      }
    }
  }

  return rc;
}